

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_UpdateLags(void)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  
  Abc_NtkIncrementTravId(pManMR->pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pManMR->pNtk->vBoxes), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pObj_00 = Abc_NtkBox(pManMR->pNtk,local_1c);
    iVar1 = Abc_ObjIsLatch(pObj_00);
    if (iVar1 != 0) {
      if (pManMR->fIsForward == 0) {
        for (local_20 = 0; iVar1 = Abc_ObjFanoutNum(pObj_00), local_20 < iVar1;
            local_20 = local_20 + 1) {
          pAVar2 = Abc_ObjFanout(pObj_00,local_20);
          Abc_FlowRetime_UpdateLags_back_rec(pAVar2);
        }
      }
      else {
        for (local_20 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_20 < iVar1;
            local_20 = local_20 + 1) {
          pAVar2 = Abc_ObjFanin(pObj_00,local_20);
          Abc_FlowRetime_UpdateLags_forw_rec(pAVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_UpdateLags( ) {
  Abc_Obj_t *pObj, *pNext;
  int i, j;

  Abc_NtkIncrementTravId( pManMR->pNtk );

  Abc_NtkForEachLatch( pManMR->pNtk, pObj, i )
    if (pManMR->fIsForward) {
      Abc_ObjForEachFanin( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_forw_rec( pNext );
    } else {
      Abc_ObjForEachFanout( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_back_rec( pNext );
    }
}